

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher<bool(int),std::tuple<int>>::call_matcher<int_const&>
          (call_matcher<bool(int),std::tuple<int>> *this,char *file,unsigned_long line,
          char *call_string,int *u)

{
  unique_ptr<trompeloeil::sequence_handler<0UL>,_std::default_delete<trompeloeil::sequence_handler<0UL>_>_>
  local_48;
  location local_40;
  int *local_30;
  int *u_local;
  char *call_string_local;
  unsigned_long line_local;
  char *file_local;
  call_matcher<bool_(int),_std::tuple<int>_> *this_local;
  
  local_30 = u;
  u_local = (int *)call_string;
  call_string_local = (char *)line;
  line_local = (unsigned_long)file;
  file_local = (char *)this;
  location::location(&local_40,file,line);
  call_matcher_base<bool_(int)>::call_matcher_base
            ((call_matcher_base<bool_(int)> *)this,local_40,(char *)u_local);
  expectation::expectation((expectation *)(this + 0x30));
  *(undefined ***)this = &PTR__call_matcher_007c31c8;
  *(undefined **)(this + 0x30) = &DAT_007c3230;
  list<trompeloeil::condition_base<bool_(int)>,_trompeloeil::delete_disposer>::list
            ((list<trompeloeil::condition_base<bool_(int)>,_trompeloeil::delete_disposer> *)
             (this + 0x38));
  list<trompeloeil::side_effect_base<bool_(int)>,_trompeloeil::delete_disposer>::list
            ((list<trompeloeil::side_effect_base<bool_(int)>,_trompeloeil::delete_disposer> *)
             (this + 0x50));
  std::
  unique_ptr<trompeloeil::return_handler<bool(int)>,std::default_delete<trompeloeil::return_handler<bool(int)>>>
  ::unique_ptr<std::default_delete<trompeloeil::return_handler<bool(int)>>,void>
            ((unique_ptr<trompeloeil::return_handler<bool(int)>,std::default_delete<trompeloeil::return_handler<bool(int)>>>
              *)(this + 0x68));
  std::make_unique<trompeloeil::sequence_handler<0ul>>();
  std::
  unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
  ::
  unique_ptr<trompeloeil::sequence_handler<0ul>,std::default_delete<trompeloeil::sequence_handler<0ul>>,void>
            ((unique_ptr<trompeloeil::sequence_handler_base,std::default_delete<trompeloeil::sequence_handler_base>>
              *)(this + 0x70),&local_48);
  std::
  unique_ptr<trompeloeil::sequence_handler<0UL>,_std::default_delete<trompeloeil::sequence_handler<0UL>_>_>
  ::~unique_ptr(&local_48);
  std::tuple<int>::tuple<true,_true>((tuple<int> *)(this + 0x78),local_30);
  this[0x7c] = (call_matcher<bool(int),std::tuple<int>>)0x0;
  return;
}

Assistant:

call_matcher(
      char const *file,
      unsigned long line,
      char const *call_string,
      U &&... u)
    : call_matcher_base<Sig>(location{file, line}, call_string)
    , val(std::forward<U>(u)...)
    {}